

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Decode.cpp
# Opt level: O2

void idx2::DecompressChunk(bitstream *ChunkStream,chunk_cache *ChunkCache,u64 ChunkAddress,int L)

{
  long *plVar1;
  byte *pbVar2;
  byte *pbVar3;
  i64 iVar4;
  allocator *paVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  unsigned_long uVar9;
  uint uVar10;
  byte bVar11;
  int iVar12;
  int I;
  long lVar13;
  uint uVar14;
  u32 V;
  ulong uVar15;
  ulong uVar16;
  u64 *puVar17;
  u64 *puVar18;
  u64 uVar19;
  byte *pbVar20;
  byte *pbVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  int local_40;
  
  puVar18 = (u64 *)(ChunkStream->Stream).Data;
  ChunkStream->BitBuf = 0;
  ChunkStream->BitPtr = (byte *)puVar18;
  uVar19 = *puVar18;
  ChunkStream->BitBuf = uVar19;
  ChunkStream->BitPos = 0;
  uVar9 = bitstream::Masks.Arr[1];
  bVar11 = 0;
  uVar10 = 0;
  uVar15 = 0;
  do {
    puVar17 = puVar18;
    if (0x39 < (int)uVar10) {
      puVar17 = (u64 *)((long)puVar18 + (ulong)(uVar10 >> 3));
      ChunkStream->BitPtr = (byte *)puVar17;
      uVar19 = *(u64 *)((long)puVar18 + (ulong)(uVar10 >> 3));
      ChunkStream->BitBuf = uVar19;
      uVar10 = uVar10 & 7;
    }
    uVar23 = uVar19 >> ((byte)uVar10 & 0x3f) & bitstream::Masks.Arr[7];
    uVar14 = uVar10 + 7;
    puVar18 = puVar17;
    if (0x38 < (int)uVar10) {
      puVar18 = (u64 *)((long)puVar17 + (ulong)(uVar14 >> 3));
      ChunkStream->BitPtr = (byte *)puVar18;
      uVar19 = *(u64 *)((long)puVar17 + (ulong)(uVar14 >> 3));
      ChunkStream->BitBuf = uVar19;
      uVar14 = 0;
    }
    uVar15 = uVar15 + (uVar23 << (bVar11 & 0x3f));
    uVar10 = uVar14 + 1;
    bVar11 = bVar11 + 7;
  } while ((uVar19 >> ((byte)uVar14 & 0x3f) & uVar9) != 0);
  bVar11 = 0;
  lVar24 = 0;
  do {
    puVar17 = puVar18;
    if (0x39 < (int)uVar10) {
      puVar17 = (u64 *)((long)puVar18 + (ulong)(uVar10 >> 3));
      ChunkStream->BitPtr = (byte *)puVar17;
      uVar19 = *(u64 *)((long)puVar18 + (ulong)(uVar10 >> 3));
      ChunkStream->BitBuf = uVar19;
      uVar10 = uVar10 & 7;
    }
    uVar23 = uVar19 >> ((byte)uVar10 & 0x3f) & bitstream::Masks.Arr[7];
    uVar14 = uVar10 + 7;
    puVar18 = puVar17;
    if (0x38 < (int)uVar10) {
      puVar18 = (u64 *)((long)puVar17 + (ulong)(uVar14 >> 3));
      ChunkStream->BitPtr = (byte *)puVar18;
      uVar19 = *(u64 *)((long)puVar17 + (ulong)(uVar14 >> 3));
      ChunkStream->BitBuf = uVar19;
      uVar14 = 0;
    }
    lVar24 = lVar24 + (uVar23 << (bVar11 & 0x3f));
    uVar10 = uVar14 + 1;
    bVar11 = bVar11 + 7;
  } while ((uVar19 >> ((byte)uVar14 & 0x3f) & uVar9) != 0);
  ChunkStream->BitPos = uVar10;
  Resize<unsigned_long>(&ChunkCache->Bricks,(long)(int)uVar15);
  plVar1 = (long *)(ChunkCache->Bricks).Buffer.Data;
  *plVar1 = lVar24;
  for (uVar23 = 1; uVar9 = bitstream::Masks.Arr[1], uVar23 != (uVar15 & 0xffffffff);
      uVar23 = uVar23 + 1) {
    uVar10 = ChunkStream->BitPos;
    uVar19 = ChunkStream->BitBuf;
    uVar16 = 0;
    do {
      if (0x3f < (int)uVar10) {
        pbVar21 = ChunkStream->BitPtr;
        ChunkStream->BitPtr = pbVar21 + (uVar10 >> 3);
        uVar19 = *(u64 *)(pbVar21 + (uVar10 >> 3));
        ChunkStream->BitBuf = uVar19;
        uVar10 = uVar10 & 7;
      }
      bVar11 = (byte)uVar10;
      uVar10 = uVar10 + 1;
      uVar16 = (ulong)((int)uVar16 + 1);
    } while ((uVar19 >> (bVar11 & 0x3f) & uVar9) == 0);
    ChunkStream->BitPos = uVar10;
    lVar24 = lVar24 + uVar16;
    plVar1[uVar23] = lVar24;
  }
  Resize<int>(&ChunkCache->BrickOffsets,(long)(int)uVar15);
  pbVar2 = (ChunkStream->Stream).Data;
  pbVar3 = ChunkStream->BitPtr;
  iVar12 = ChunkStream->BitPos + 7 >> 3;
  pbVar21 = pbVar3 + iVar12;
  ChunkStream->BitPtr = pbVar21;
  uVar19 = *(u64 *)(pbVar3 + iVar12);
  ChunkStream->BitBuf = uVar19;
  ChunkStream->BitPos = 0;
  pbVar3 = (ChunkCache->BrickOffsets).Buffer.Data;
  pbVar3[0] = '\0';
  uVar9 = bitstream::Masks.Arr[1];
  pbVar3[1] = '\0';
  pbVar3[2] = '\0';
  pbVar3[3] = '\0';
  lVar24 = (ChunkCache->BrickOffsets).Size;
  iVar12 = 0;
  for (lVar13 = 1; uVar10 = ChunkStream->BitPos, lVar24 != lVar13; lVar13 = lVar13 + 1) {
    bVar11 = 0;
    lVar22 = 0;
    do {
      pbVar20 = pbVar21;
      if (0x39 < (int)uVar10) {
        pbVar20 = pbVar21 + (uVar10 >> 3);
        ChunkStream->BitPtr = pbVar20;
        uVar19 = *(u64 *)(pbVar21 + (uVar10 >> 3));
        ChunkStream->BitBuf = uVar19;
        uVar10 = uVar10 & 7;
      }
      uVar15 = uVar19 >> ((byte)uVar10 & 0x3f) & bitstream::Masks.Arr[7];
      uVar14 = uVar10 + 7;
      pbVar21 = pbVar20;
      if (0x38 < (int)uVar10) {
        pbVar21 = pbVar20 + (uVar14 >> 3);
        ChunkStream->BitPtr = pbVar21;
        uVar19 = *(u64 *)(pbVar20 + (uVar14 >> 3));
        ChunkStream->BitBuf = uVar19;
        uVar14 = 0;
      }
      lVar22 = lVar22 + (uVar15 << (bVar11 & 0x3f));
      uVar10 = uVar14 + 1;
      bVar11 = bVar11 + 7;
    } while ((uVar19 >> ((byte)uVar14 & 0x3f) & uVar9) != 0);
    ChunkStream->BitPos = uVar10;
    iVar12 = iVar12 + (int)lVar22;
    *(int *)(pbVar3 + lVar13 * 4) = iVar12;
  }
  do {
    if ((int)uVar10 < 0x3a) {
      if (uVar10 == 0x39) {
        ChunkStream->BitPtr = pbVar21 + 8;
        uVar19 = *(u64 *)(pbVar21 + 8);
        ChunkStream->BitBuf = uVar19;
        iVar12 = 0;
        pbVar21 = pbVar21 + 8;
      }
      else {
        iVar12 = uVar10 + 7;
      }
    }
    else {
      ChunkStream->BitPtr = pbVar21 + (uVar10 >> 3);
      uVar19 = *(u64 *)(pbVar21 + (uVar10 >> 3));
      ChunkStream->BitBuf = uVar19;
      iVar12 = (uVar10 & 7) + 7;
      pbVar21 = pbVar21 + (uVar10 >> 3);
    }
    uVar10 = iVar12 + 1;
  } while ((uVar19 >> ((byte)iVar12 & 0x3f) & uVar9) != 0);
  ChunkStream->BitPos = uVar10;
  local_40 = (int)pbVar2;
  for (lVar13 = 0; lVar24 << 2 != lVar13; lVar13 = lVar13 + 4) {
    *(int *)(pbVar3 + lVar13) =
         *(int *)(pbVar3 + lVar13) + ((int)pbVar21 - local_40) + (ChunkStream->BitPos + 7) / 8;
  }
  pbVar21 = (ChunkStream->Stream).Data;
  iVar4 = (ChunkStream->Stream).Bytes;
  paVar5 = (ChunkStream->Stream).Alloc;
  pbVar2 = ChunkStream->BitPtr;
  uVar6 = *(undefined8 *)((long)&(ChunkStream->Stream).Alloc + 4);
  uVar7 = *(undefined8 *)((long)&ChunkStream->BitPtr + 4);
  uVar8 = *(undefined8 *)((long)&ChunkStream->BitBuf + 4);
  *(undefined8 *)((long)&(ChunkCache->ChunkStream).Stream.Bytes + 4) =
       *(undefined8 *)((long)&(ChunkStream->Stream).Bytes + 4);
  *(undefined8 *)((long)&(ChunkCache->ChunkStream).Stream.Alloc + 4) = uVar6;
  *(undefined8 *)((long)&(ChunkCache->ChunkStream).BitPtr + 4) = uVar7;
  *(undefined8 *)((long)&(ChunkCache->ChunkStream).BitBuf + 4) = uVar8;
  (ChunkCache->ChunkStream).Stream.Data = pbVar21;
  (ChunkCache->ChunkStream).Stream.Bytes = iVar4;
  (ChunkCache->ChunkStream).Stream.Alloc = paVar5;
  (ChunkCache->ChunkStream).BitPtr = pbVar2;
  return;
}

Assistant:

void
DecompressChunk(bitstream* ChunkStream, chunk_cache* ChunkCache, u64 ChunkAddress, int L)
{
  (void)L;
  u64 Brk = ((ChunkAddress >> 18) & 0x3FFFFFFFFFFull);
  (void)Brk;
  InitRead(ChunkStream, ChunkStream->Stream);
  int NBricks = (int)ReadVarByte(ChunkStream);
  idx2_Assert(NBricks > 0);

  /* decompress and store the brick ids */
  u64 Brick = ReadVarByte(ChunkStream);
  Resize(&ChunkCache->Bricks, NBricks);
  ChunkCache->Bricks[0] = Brick;
  idx2_For (int, I, 1, NBricks)
  {
    Brick += ReadUnary(ChunkStream) + 1;
    ChunkCache->Bricks[I] = Brick;
    idx2_Assert(Brk == (Brick >> L));
  }

  Resize(&ChunkCache->BrickOffsets, NBricks);
  /* decompress and store the brick sizes */
  i32 BrickSize = 0;
  SeekToNextByte(ChunkStream);
  ChunkCache->BrickOffsets[0] = 0;
  idx2_For (int, I, 1, Size(ChunkCache->BrickOffsets))
  {
    ChunkCache->BrickOffsets[I] = (BrickSize += (i32)ReadVarByte(ChunkStream));
  }
  ReadVarByte(ChunkStream); // the size of the last brick (ignored here)
  idx2_ForEach (BrickSzIt, ChunkCache->BrickOffsets)
    *BrickSzIt += (i32)Size(*ChunkStream);
  ChunkCache->ChunkStream = *ChunkStream;
}